

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

string * __thiscall
Catch::StringMaker<char_const*,void>::convert_abi_cxx11_
          (string *__return_storage_ptr__,StringMaker<char_const*,void> *this,char *str)

{
  char *pcVar1;
  size_type in_RCX;
  StringRef string;
  
  if (this == (StringMaker<char_const*,void> *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"{null string}","");
  }
  else {
    pcVar1 = (char *)strlen((char *)this);
    string.m_size = in_RCX;
    string.m_start = pcVar1;
    Detail::convertIntoString_abi_cxx11_(__return_storage_ptr__,(Detail *)this,string);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StringMaker<char const*>::convert(char const* str) {
    if (str) {
        return Detail::convertIntoString( str );
    } else {
        return{ "{null string}" };
    }
}